

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

void __thiscall dg::llvmdg::LazyLLVMCallGraph::_initializeAddressTaken(LazyLLVMCallGraph *this)

{
  Module *pMVar1;
  char cVar2;
  bool bVar3;
  Module *pMVar4;
  Module *fun;
  Function *local_30;
  
  this->_address_taken_initialized = true;
  pMVar1 = this->_module;
  for (pMVar4 = pMVar1 + 0x20; pMVar4 = *(Module **)pMVar4, pMVar4 != pMVar1 + 0x18;
      pMVar4 = pMVar4 + 8) {
    fun = pMVar4 + -0x38;
    if (pMVar4 == (Module *)0x0) {
      fun = (Module *)0x0;
    }
    cVar2 = llvm::GlobalValue::isDeclaration();
    if (cVar2 == '\0') {
      bVar3 = funHasAddressTaken((Function *)fun);
      if (bVar3) {
        local_30 = (Function *)fun;
        std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
        emplace_back<llvm::Function_const*>
                  ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                   &this->_address_taken,&local_30);
      }
    }
  }
  return;
}

Assistant:

void _initializeAddressTaken() {
        assert(!_address_taken_initialized);
        _address_taken_initialized = true;

        for (auto &F : *_module) {
            if (F.isDeclaration())
                continue;
            if (funHasAddressTaken(&F)) {
                _address_taken.push_back(&F);
            }
        }
    }